

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void notifier(EventCount *eventCount)

{
  ostream *poVar1;
  int i;
  int iVar2;
  
  for (iVar2 = 0; iVar2 != 100; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Notifying: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    EventCount::notify(eventCount);
    poVar1 = std::operator<<((ostream *)&std::cout,"Notified: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    usleep(100);
  }
  return;
}

Assistant:

void notifier(EventCount *eventCount) {
    for (int i = 0; i < 100; i++) {
        std::cout << "Notifying: " << i << std::endl;
        eventCount->notify();
        std::cout << "Notified: " << i << std::endl;
        usleep(100);
    }
}